

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O0

string * __thiscall
flatbuffers::jsons::JsonSchemaGenerator::GeneratedFileName
          (string *__return_storage_ptr__,JsonSchemaGenerator *this,string *path,string *file_name,
          IDLOptions *options)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  IDLOptions *local_30;
  IDLOptions *options_local;
  string *file_name_local;
  string *path_local;
  JsonSchemaGenerator *this_local;
  
  local_30 = options;
  options_local = (IDLOptions *)file_name;
  file_name_local = path;
  path_local = (string *)this;
  this_local = (JsonSchemaGenerator *)__return_storage_ptr__;
  std::operator+(&local_50,path,file_name);
  std::operator+(__return_storage_ptr__,&local_50,".schema.json");
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedFileName(const std::string &path,
                                const std::string &file_name,
                                const IDLOptions &options /* unused */) const {
    (void)options;
    return path + file_name + ".schema.json";
  }